

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_rounding_unroll_2_24_True_winner_unconditional
               (integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int row;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_1;
  int gauss_index_k;
  float gauss_s1_y;
  int l_1;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale23;
  int sample_x_sub_int_scale22;
  int sample_x_sub_int_scale21;
  int sample_x_sub_int_scale20;
  int sample_x_sub_int_scale19;
  int sample_x_sub_int_scale18;
  int sample_x_sub_int_scale17;
  int sample_x_sub_int_scale16;
  int sample_x_sub_int_scale15;
  int sample_x_sub_int_scale14;
  int sample_x_sub_int_scale13;
  int sample_x_sub_int_scale12;
  int sample_x_sub_int_scale11;
  int sample_x_sub_int_scale10;
  int sample_x_sub_int_scale9;
  int sample_x_sub_int_scale8;
  int sample_x_sub_int_scale7;
  int sample_x_sub_int_scale6;
  int sample_x_sub_int_scale5;
  int sample_x_sub_int_scale4;
  int sample_x_sub_int_scale3;
  int sample_x_sub_int_scale2;
  int sample_x_sub_int_scale0;
  int sample_x_sub_int_scale1;
  float ipoint_x_sub_int_scale_add_k23_mul_scale;
  float ipoint_x_sub_int_scale_add_k22_mul_scale;
  float ipoint_x_sub_int_scale_add_k21_mul_scale;
  float ipoint_x_sub_int_scale_add_k20_mul_scale;
  float ipoint_x_sub_int_scale_add_k19_mul_scale;
  float ipoint_x_sub_int_scale_add_k18_mul_scale;
  float ipoint_x_sub_int_scale_add_k17_mul_scale;
  float ipoint_x_sub_int_scale_add_k16_mul_scale;
  float ipoint_x_sub_int_scale_add_k15_mul_scale;
  float ipoint_x_sub_int_scale_add_k14_mul_scale;
  float ipoint_x_sub_int_scale_add_k13_mul_scale;
  float ipoint_x_sub_int_scale_add_k12_mul_scale;
  float ipoint_x_sub_int_scale_add_k11_mul_scale;
  float ipoint_x_sub_int_scale_add_k10_mul_scale;
  float ipoint_x_sub_int_scale_add_k9_mul_scale;
  float ipoint_x_sub_int_scale_add_k8_mul_scale;
  float ipoint_x_sub_int_scale_add_k7_mul_scale;
  float ipoint_x_sub_int_scale_add_k6_mul_scale;
  float ipoint_x_sub_int_scale_add_k5_mul_scale;
  float ipoint_x_sub_int_scale_add_k4_mul_scale;
  float ipoint_x_sub_int_scale_add_k3_mul_scale;
  float ipoint_x_sub_int_scale_add_k2_mul_scale;
  float ipoint_x_sub_int_scale_add_k1_mul_scale;
  float ipoint_x_sub_int_scale_add_k0_mul_scale;
  int k_count23;
  int k_count22;
  int k_count21;
  int k_count20;
  int k_count19;
  int k_count18;
  int k_count17;
  int k_count16;
  int k_count15;
  int k_count14;
  int k_count13;
  int k_count12;
  int k_count11;
  int k_count10;
  int k_count9;
  int k_count8;
  int k_count7;
  int k_count6;
  int k_count5;
  int k_count4;
  int k_count3;
  int k_count2;
  int k_count1;
  int k_count0;
  int k23;
  int k22;
  int k21;
  int k20;
  int k19;
  int k18;
  int k17;
  int k16;
  int k15;
  int k14;
  int k13;
  int k12;
  int k11;
  int k10;
  int k9;
  int k8;
  int k7;
  int k6;
  int k5;
  int k4;
  int k3;
  int k2;
  int k1;
  int k0;
  int k_count;
  int k;
  int sample_y_sub_int_scale1;
  int sample_y_sub_int_scale0;
  float ipoint_y_sub_int_scale_add_l1_mul_scale;
  float ipoint_y_sub_int_scale_add_l0_mul_scale;
  int l_count1;
  int l_count0;
  int l1;
  int l0;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_2f4;
  int local_2c0;
  int local_2bc;
  int local_2b4;
  int local_2ac;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  float local_29c;
  float *local_298;
  int local_28c;
  float *local_280;
  int local_278;
  int local_84;
  int local_80;
  int local_5c;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  fVar78 = in_RSI[2];
  auVar36._8_4_ = 0x80000000;
  auVar36._0_8_ = 0x8000000080000000;
  auVar36._12_4_ = 0x80000000;
  auVar30._8_4_ = 0x3effffff;
  auVar30._0_8_ = 0x3effffff3effffff;
  auVar30._12_4_ = 0x3effffff;
  auVar29 = vpternlogd_avx512vl(auVar30,ZEXT416((uint)fVar78),auVar36,0xf8);
  auVar29 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)(fVar78 + auVar29._0_4_)),0xb);
  iVar3 = (int)auVar29._0_4_;
  fVar53 = -0.08 / (fVar78 * fVar78);
  fVar1 = *in_RSI;
  auVar37._8_4_ = 0x80000000;
  auVar37._0_8_ = 0x8000000080000000;
  auVar37._12_4_ = 0x80000000;
  auVar32._8_4_ = 0x3effffff;
  auVar32._0_8_ = 0x3effffff3effffff;
  auVar32._12_4_ = 0x3effffff;
  auVar29 = vpternlogd_avx512vl(auVar32,ZEXT416((uint)fVar1),auVar37,0xf8);
  auVar29 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar29._0_4_)),0xb);
  auVar34._0_8_ = (double)auVar29._0_4_;
  auVar34._8_8_ = 0;
  auVar29._0_8_ = (double)fVar78;
  auVar29._8_8_ = 0;
  auVar30 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar29,auVar34);
  fVar1 = in_RSI[1];
  auVar38._8_4_ = 0x80000000;
  auVar38._0_8_ = 0x8000000080000000;
  auVar38._12_4_ = 0x80000000;
  auVar33._8_4_ = 0x3effffff;
  auVar33._0_8_ = 0x3effffff3effffff;
  auVar33._12_4_ = 0x3effffff;
  auVar29 = vpternlogd_avx512vl(auVar33,ZEXT416((uint)fVar1),auVar38,0xf8);
  auVar29 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar29._0_4_)),0xb);
  auVar35._0_8_ = (double)auVar29._0_4_;
  auVar35._8_8_ = 0;
  auVar31._0_8_ = (double)fVar78;
  auVar31._8_8_ = 0;
  auVar29 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar31,auVar35);
  fVar1 = (float)auVar30._0_8_ - (float)iVar3;
  fVar2 = (float)auVar29._0_8_ - (float)iVar3;
  local_4c = 0;
  auVar79 = ZEXT1664((undefined1  [16])0x0);
  local_50 = 0.0;
  local_54 = 0;
  local_5c = 0;
  for (local_58 = -0xc; local_58 < 0xc; local_58 = local_58 + 2) {
    iVar4 = local_5c + 1;
    auVar80._0_4_ = (float)local_58;
    auVar80._4_12_ = auVar79._4_12_;
    auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar80,ZEXT416((uint)fVar2));
    fVar54 = auVar29._0_4_;
    auVar81._0_4_ = (float)(local_58 + 1);
    auVar81._4_12_ = auVar29._4_12_;
    auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar81,ZEXT416((uint)fVar2));
    fVar55 = auVar29._0_4_;
    auVar144._8_4_ = 0x80000000;
    auVar144._0_8_ = 0x8000000080000000;
    auVar144._12_4_ = 0x80000000;
    auVar82._8_4_ = 0x3effffff;
    auVar82._0_8_ = 0x3effffff3effffff;
    auVar82._12_4_ = 0x3effffff;
    auVar29 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)fVar54),auVar144,0xf8);
    auVar29 = vroundss_avx(ZEXT416((uint)fVar54),ZEXT416((uint)(fVar54 + auVar29._0_4_)),0xb);
    iVar5 = (int)auVar29._0_4_;
    auVar145._8_4_ = 0x80000000;
    auVar145._0_8_ = 0x8000000080000000;
    auVar145._12_4_ = 0x80000000;
    auVar83._8_4_ = 0x3effffff;
    auVar83._0_8_ = 0x3effffff3effffff;
    auVar83._12_4_ = 0x3effffff;
    auVar29 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)fVar55),auVar145,0xf8);
    auVar29 = vroundss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)(fVar55 + auVar29._0_4_)),0xb);
    auVar79 = ZEXT1664(auVar29);
    row = (int)auVar29._0_4_;
    local_84 = 0;
    for (local_80 = -0xc; local_80 < 0xc; local_80 = local_80 + 0x18) {
      iVar6 = local_84 + 1;
      iVar7 = local_84 + 2;
      iVar8 = local_84 + 3;
      iVar9 = local_84 + 4;
      iVar10 = local_84 + 5;
      iVar11 = local_84 + 6;
      iVar12 = local_84 + 7;
      iVar13 = local_84 + 8;
      iVar14 = local_84 + 9;
      iVar15 = local_84 + 10;
      iVar16 = local_84 + 0xb;
      iVar17 = local_84 + 0xc;
      iVar18 = local_84 + 0xd;
      iVar19 = local_84 + 0xe;
      iVar20 = local_84 + 0xf;
      iVar21 = local_84 + 0x10;
      iVar22 = local_84 + 0x11;
      iVar23 = local_84 + 0x12;
      iVar24 = local_84 + 0x13;
      iVar25 = local_84 + 0x14;
      iVar26 = local_84 + 0x15;
      iVar27 = local_84 + 0x16;
      iVar28 = local_84 + 0x17;
      auVar84._0_4_ = (float)local_80;
      auVar84._4_12_ = auVar79._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar84,ZEXT416((uint)fVar1));
      fVar54 = auVar29._0_4_;
      auVar85._0_4_ = (float)(local_80 + 1);
      auVar85._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar85,ZEXT416((uint)fVar1));
      fVar55 = auVar29._0_4_;
      auVar86._0_4_ = (float)(local_80 + 2);
      auVar86._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar86,ZEXT416((uint)fVar1));
      fVar56 = auVar29._0_4_;
      auVar87._0_4_ = (float)(local_80 + 3);
      auVar87._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar87,ZEXT416((uint)fVar1));
      fVar57 = auVar29._0_4_;
      auVar88._0_4_ = (float)(local_80 + 4);
      auVar88._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar88,ZEXT416((uint)fVar1));
      fVar58 = auVar29._0_4_;
      auVar89._0_4_ = (float)(local_80 + 5);
      auVar89._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar89,ZEXT416((uint)fVar1));
      fVar59 = auVar29._0_4_;
      auVar90._0_4_ = (float)(local_80 + 6);
      auVar90._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar90,ZEXT416((uint)fVar1));
      fVar60 = auVar29._0_4_;
      auVar91._0_4_ = (float)(local_80 + 7);
      auVar91._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar91,ZEXT416((uint)fVar1));
      fVar61 = auVar29._0_4_;
      auVar92._0_4_ = (float)(local_80 + 8);
      auVar92._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar92,ZEXT416((uint)fVar1));
      fVar62 = auVar29._0_4_;
      auVar93._0_4_ = (float)(local_80 + 9);
      auVar93._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar93,ZEXT416((uint)fVar1));
      fVar63 = auVar29._0_4_;
      auVar94._0_4_ = (float)(local_80 + 10);
      auVar94._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar94,ZEXT416((uint)fVar1));
      fVar64 = auVar29._0_4_;
      auVar95._0_4_ = (float)(local_80 + 0xb);
      auVar95._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar95,ZEXT416((uint)fVar1));
      fVar65 = auVar29._0_4_;
      auVar96._0_4_ = (float)(local_80 + 0xc);
      auVar96._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar96,ZEXT416((uint)fVar1));
      fVar66 = auVar29._0_4_;
      auVar97._0_4_ = (float)(local_80 + 0xd);
      auVar97._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar97,ZEXT416((uint)fVar1));
      fVar67 = auVar29._0_4_;
      auVar98._0_4_ = (float)(local_80 + 0xe);
      auVar98._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar98,ZEXT416((uint)fVar1));
      fVar68 = auVar29._0_4_;
      auVar99._0_4_ = (float)(local_80 + 0xf);
      auVar99._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar99,ZEXT416((uint)fVar1));
      fVar69 = auVar29._0_4_;
      auVar100._0_4_ = (float)(local_80 + 0x10);
      auVar100._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar100,ZEXT416((uint)fVar1));
      fVar70 = auVar29._0_4_;
      auVar101._0_4_ = (float)(local_80 + 0x11);
      auVar101._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar101,ZEXT416((uint)fVar1));
      fVar71 = auVar29._0_4_;
      auVar102._0_4_ = (float)(local_80 + 0x12);
      auVar102._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar102,ZEXT416((uint)fVar1));
      fVar72 = auVar29._0_4_;
      auVar103._0_4_ = (float)(local_80 + 0x13);
      auVar103._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar103,ZEXT416((uint)fVar1));
      fVar73 = auVar29._0_4_;
      auVar104._0_4_ = (float)(local_80 + 0x14);
      auVar104._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar104,ZEXT416((uint)fVar1));
      fVar74 = auVar29._0_4_;
      auVar105._0_4_ = (float)(local_80 + 0x15);
      auVar105._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar105,ZEXT416((uint)fVar1));
      fVar75 = auVar29._0_4_;
      auVar106._0_4_ = (float)(local_80 + 0x16);
      auVar106._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar106,ZEXT416((uint)fVar1));
      fVar76 = auVar29._0_4_;
      auVar107._0_4_ = (float)(local_80 + 0x17);
      auVar107._4_12_ = auVar29._4_12_;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar78),auVar107,ZEXT416((uint)fVar1));
      fVar77 = auVar29._0_4_;
      auVar146._8_4_ = 0x80000000;
      auVar146._0_8_ = 0x8000000080000000;
      auVar146._12_4_ = 0x80000000;
      auVar108._8_4_ = 0x3effffff;
      auVar108._0_8_ = 0x3effffff3effffff;
      auVar108._12_4_ = 0x3effffff;
      auVar29 = vpternlogd_avx512vl(auVar108,ZEXT416((uint)fVar55),auVar146,0xf8);
      auVar29 = vroundss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)(fVar55 + auVar29._0_4_)),0xb);
      auVar147._8_4_ = 0x80000000;
      auVar147._0_8_ = 0x8000000080000000;
      auVar147._12_4_ = 0x80000000;
      auVar109._8_4_ = 0x3effffff;
      auVar109._0_8_ = 0x3effffff3effffff;
      auVar109._12_4_ = 0x3effffff;
      auVar30 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)fVar54),auVar147,0xf8);
      auVar30 = vroundss_avx(ZEXT416((uint)fVar54),ZEXT416((uint)(fVar54 + auVar30._0_4_)),0xb);
      auVar148._8_4_ = 0x80000000;
      auVar148._0_8_ = 0x8000000080000000;
      auVar148._12_4_ = 0x80000000;
      auVar110._8_4_ = 0x3effffff;
      auVar110._0_8_ = 0x3effffff3effffff;
      auVar110._12_4_ = 0x3effffff;
      auVar31 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)fVar56),auVar148,0xf8);
      auVar31 = vroundss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)(fVar56 + auVar31._0_4_)),0xb);
      auVar149._8_4_ = 0x80000000;
      auVar149._0_8_ = 0x8000000080000000;
      auVar149._12_4_ = 0x80000000;
      auVar111._8_4_ = 0x3effffff;
      auVar111._0_8_ = 0x3effffff3effffff;
      auVar111._12_4_ = 0x3effffff;
      auVar32 = vpternlogd_avx512vl(auVar111,ZEXT416((uint)fVar57),auVar149,0xf8);
      auVar32 = vroundss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)(fVar57 + auVar32._0_4_)),0xb);
      auVar150._8_4_ = 0x80000000;
      auVar150._0_8_ = 0x8000000080000000;
      auVar150._12_4_ = 0x80000000;
      auVar112._8_4_ = 0x3effffff;
      auVar112._0_8_ = 0x3effffff3effffff;
      auVar112._12_4_ = 0x3effffff;
      auVar33 = vpternlogd_avx512vl(auVar112,ZEXT416((uint)fVar58),auVar150,0xf8);
      auVar33 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)(fVar58 + auVar33._0_4_)),0xb);
      auVar151._8_4_ = 0x80000000;
      auVar151._0_8_ = 0x8000000080000000;
      auVar151._12_4_ = 0x80000000;
      auVar113._8_4_ = 0x3effffff;
      auVar113._0_8_ = 0x3effffff3effffff;
      auVar113._12_4_ = 0x3effffff;
      auVar34 = vpternlogd_avx512vl(auVar113,ZEXT416((uint)fVar59),auVar151,0xf8);
      auVar34 = vroundss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)(fVar59 + auVar34._0_4_)),0xb);
      auVar152._8_4_ = 0x80000000;
      auVar152._0_8_ = 0x8000000080000000;
      auVar152._12_4_ = 0x80000000;
      auVar114._8_4_ = 0x3effffff;
      auVar114._0_8_ = 0x3effffff3effffff;
      auVar114._12_4_ = 0x3effffff;
      auVar35 = vpternlogd_avx512vl(auVar114,ZEXT416((uint)fVar60),auVar152,0xf8);
      auVar35 = vroundss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)(fVar60 + auVar35._0_4_)),0xb);
      auVar153._8_4_ = 0x80000000;
      auVar153._0_8_ = 0x8000000080000000;
      auVar153._12_4_ = 0x80000000;
      auVar115._8_4_ = 0x3effffff;
      auVar115._0_8_ = 0x3effffff3effffff;
      auVar115._12_4_ = 0x3effffff;
      auVar36 = vpternlogd_avx512vl(auVar115,ZEXT416((uint)fVar61),auVar153,0xf8);
      auVar36 = vroundss_avx(ZEXT416((uint)fVar61),ZEXT416((uint)(fVar61 + auVar36._0_4_)),0xb);
      auVar154._8_4_ = 0x80000000;
      auVar154._0_8_ = 0x8000000080000000;
      auVar154._12_4_ = 0x80000000;
      auVar116._8_4_ = 0x3effffff;
      auVar116._0_8_ = 0x3effffff3effffff;
      auVar116._12_4_ = 0x3effffff;
      auVar37 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)fVar62),auVar154,0xf8);
      auVar37 = vroundss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)(fVar62 + auVar37._0_4_)),0xb);
      auVar155._8_4_ = 0x80000000;
      auVar155._0_8_ = 0x8000000080000000;
      auVar155._12_4_ = 0x80000000;
      auVar117._8_4_ = 0x3effffff;
      auVar117._0_8_ = 0x3effffff3effffff;
      auVar117._12_4_ = 0x3effffff;
      auVar38 = vpternlogd_avx512vl(auVar117,ZEXT416((uint)fVar63),auVar155,0xf8);
      auVar38 = vroundss_avx(ZEXT416((uint)fVar63),ZEXT416((uint)(fVar63 + auVar38._0_4_)),0xb);
      auVar156._8_4_ = 0x80000000;
      auVar156._0_8_ = 0x8000000080000000;
      auVar156._12_4_ = 0x80000000;
      auVar118._8_4_ = 0x3effffff;
      auVar118._0_8_ = 0x3effffff3effffff;
      auVar118._12_4_ = 0x3effffff;
      auVar39 = vpternlogd_avx512vl(auVar118,ZEXT416((uint)fVar64),auVar156,0xf8);
      auVar39 = vroundss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)(fVar64 + auVar39._0_4_)),0xb);
      auVar157._8_4_ = 0x80000000;
      auVar157._0_8_ = 0x8000000080000000;
      auVar157._12_4_ = 0x80000000;
      auVar119._8_4_ = 0x3effffff;
      auVar119._0_8_ = 0x3effffff3effffff;
      auVar119._12_4_ = 0x3effffff;
      auVar40 = vpternlogd_avx512vl(auVar119,ZEXT416((uint)fVar65),auVar157,0xf8);
      auVar40 = vroundss_avx(ZEXT416((uint)fVar65),ZEXT416((uint)(fVar65 + auVar40._0_4_)),0xb);
      auVar158._8_4_ = 0x80000000;
      auVar158._0_8_ = 0x8000000080000000;
      auVar158._12_4_ = 0x80000000;
      auVar120._8_4_ = 0x3effffff;
      auVar120._0_8_ = 0x3effffff3effffff;
      auVar120._12_4_ = 0x3effffff;
      auVar41 = vpternlogd_avx512vl(auVar120,ZEXT416((uint)fVar66),auVar158,0xf8);
      auVar41 = vroundss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)(fVar66 + auVar41._0_4_)),0xb);
      auVar159._8_4_ = 0x80000000;
      auVar159._0_8_ = 0x8000000080000000;
      auVar159._12_4_ = 0x80000000;
      auVar121._8_4_ = 0x3effffff;
      auVar121._0_8_ = 0x3effffff3effffff;
      auVar121._12_4_ = 0x3effffff;
      auVar42 = vpternlogd_avx512vl(auVar121,ZEXT416((uint)fVar67),auVar159,0xf8);
      auVar42 = vroundss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)(fVar67 + auVar42._0_4_)),0xb);
      auVar160._8_4_ = 0x80000000;
      auVar160._0_8_ = 0x8000000080000000;
      auVar160._12_4_ = 0x80000000;
      auVar122._8_4_ = 0x3effffff;
      auVar122._0_8_ = 0x3effffff3effffff;
      auVar122._12_4_ = 0x3effffff;
      auVar43 = vpternlogd_avx512vl(auVar122,ZEXT416((uint)fVar68),auVar160,0xf8);
      auVar43 = vroundss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)(fVar68 + auVar43._0_4_)),0xb);
      auVar161._8_4_ = 0x80000000;
      auVar161._0_8_ = 0x8000000080000000;
      auVar161._12_4_ = 0x80000000;
      auVar123._8_4_ = 0x3effffff;
      auVar123._0_8_ = 0x3effffff3effffff;
      auVar123._12_4_ = 0x3effffff;
      auVar44 = vpternlogd_avx512vl(auVar123,ZEXT416((uint)fVar69),auVar161,0xf8);
      auVar44 = vroundss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)(fVar69 + auVar44._0_4_)),0xb);
      auVar162._8_4_ = 0x80000000;
      auVar162._0_8_ = 0x8000000080000000;
      auVar162._12_4_ = 0x80000000;
      auVar124._8_4_ = 0x3effffff;
      auVar124._0_8_ = 0x3effffff3effffff;
      auVar124._12_4_ = 0x3effffff;
      auVar45 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)fVar70),auVar162,0xf8);
      auVar45 = vroundss_avx(ZEXT416((uint)fVar70),ZEXT416((uint)(fVar70 + auVar45._0_4_)),0xb);
      auVar163._8_4_ = 0x80000000;
      auVar163._0_8_ = 0x8000000080000000;
      auVar163._12_4_ = 0x80000000;
      auVar125._8_4_ = 0x3effffff;
      auVar125._0_8_ = 0x3effffff3effffff;
      auVar125._12_4_ = 0x3effffff;
      auVar46 = vpternlogd_avx512vl(auVar125,ZEXT416((uint)fVar71),auVar163,0xf8);
      auVar46 = vroundss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)(fVar71 + auVar46._0_4_)),0xb);
      auVar164._8_4_ = 0x80000000;
      auVar164._0_8_ = 0x8000000080000000;
      auVar164._12_4_ = 0x80000000;
      auVar126._8_4_ = 0x3effffff;
      auVar126._0_8_ = 0x3effffff3effffff;
      auVar126._12_4_ = 0x3effffff;
      auVar47 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)fVar72),auVar164,0xf8);
      auVar47 = vroundss_avx(ZEXT416((uint)fVar72),ZEXT416((uint)(fVar72 + auVar47._0_4_)),0xb);
      auVar165._8_4_ = 0x80000000;
      auVar165._0_8_ = 0x8000000080000000;
      auVar165._12_4_ = 0x80000000;
      auVar127._8_4_ = 0x3effffff;
      auVar127._0_8_ = 0x3effffff3effffff;
      auVar127._12_4_ = 0x3effffff;
      auVar48 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)fVar73),auVar165,0xf8);
      auVar48 = vroundss_avx(ZEXT416((uint)fVar73),ZEXT416((uint)(fVar73 + auVar48._0_4_)),0xb);
      auVar166._8_4_ = 0x80000000;
      auVar166._0_8_ = 0x8000000080000000;
      auVar166._12_4_ = 0x80000000;
      auVar128._8_4_ = 0x3effffff;
      auVar128._0_8_ = 0x3effffff3effffff;
      auVar128._12_4_ = 0x3effffff;
      auVar49 = vpternlogd_avx512vl(auVar128,ZEXT416((uint)fVar74),auVar166,0xf8);
      auVar49 = vroundss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)(fVar74 + auVar49._0_4_)),0xb);
      auVar167._8_4_ = 0x80000000;
      auVar167._0_8_ = 0x8000000080000000;
      auVar167._12_4_ = 0x80000000;
      auVar129._8_4_ = 0x3effffff;
      auVar129._0_8_ = 0x3effffff3effffff;
      auVar129._12_4_ = 0x3effffff;
      auVar50 = vpternlogd_avx512vl(auVar129,ZEXT416((uint)fVar75),auVar167,0xf8);
      auVar50 = vroundss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)(fVar75 + auVar50._0_4_)),0xb);
      auVar168._8_4_ = 0x80000000;
      auVar168._0_8_ = 0x8000000080000000;
      auVar168._12_4_ = 0x80000000;
      auVar130._8_4_ = 0x3effffff;
      auVar130._0_8_ = 0x3effffff3effffff;
      auVar130._12_4_ = 0x3effffff;
      auVar51 = vpternlogd_avx512vl(auVar130,ZEXT416((uint)fVar76),auVar168,0xf8);
      auVar51 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)(fVar76 + auVar51._0_4_)),0xb);
      auVar169._8_4_ = 0x80000000;
      auVar169._0_8_ = 0x8000000080000000;
      auVar169._12_4_ = 0x80000000;
      auVar131._8_4_ = 0x3effffff;
      auVar131._0_8_ = 0x3effffff3effffff;
      auVar131._12_4_ = 0x3effffff;
      auVar52 = vpternlogd_avx512vl(auVar131,ZEXT416((uint)fVar77),auVar169,0xf8);
      auVar52 = vroundss_avx(ZEXT416((uint)fVar77),ZEXT416((uint)(fVar77 + auVar52._0_4_)),0xb);
      auVar79 = ZEXT1664(auVar52);
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar30._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + local_84),
                 haarResponseY + (local_5c * 0x18 + local_84));
      haarXY_unconditional
                (in_RDI,row,(int)auVar30._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + local_84),
                 haarResponseY + (iVar4 * 0x18 + local_84));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar29._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar6),
                 haarResponseY + (local_5c * 0x18 + iVar6));
      haarXY_unconditional
                (in_RDI,row,(int)auVar29._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar6),
                 haarResponseY + (iVar4 * 0x18 + iVar6));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar31._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar7),
                 haarResponseY + (local_5c * 0x18 + iVar7));
      haarXY_unconditional
                (in_RDI,row,(int)auVar31._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar7),
                 haarResponseY + (iVar4 * 0x18 + iVar7));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar32._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar8),
                 haarResponseY + (local_5c * 0x18 + iVar8));
      haarXY_unconditional
                (in_RDI,row,(int)auVar32._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar8),
                 haarResponseY + (iVar4 * 0x18 + iVar8));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar33._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar9),
                 haarResponseY + (local_5c * 0x18 + iVar9));
      haarXY_unconditional
                (in_RDI,row,(int)auVar33._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar9),
                 haarResponseY + (iVar4 * 0x18 + iVar9));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar34._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar10),
                 haarResponseY + (local_5c * 0x18 + iVar10));
      haarXY_unconditional
                (in_RDI,row,(int)auVar34._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar10),
                 haarResponseY + (iVar4 * 0x18 + iVar10));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar35._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar11),
                 haarResponseY + (local_5c * 0x18 + iVar11));
      haarXY_unconditional
                (in_RDI,row,(int)auVar35._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar11),
                 haarResponseY + (iVar4 * 0x18 + iVar11));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar36._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar12),
                 haarResponseY + (local_5c * 0x18 + iVar12));
      haarXY_unconditional
                (in_RDI,row,(int)auVar36._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar12),
                 haarResponseY + (iVar4 * 0x18 + iVar12));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar37._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar13),
                 haarResponseY + (local_5c * 0x18 + iVar13));
      haarXY_unconditional
                (in_RDI,row,(int)auVar37._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar13),
                 haarResponseY + (iVar4 * 0x18 + iVar13));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar38._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar14),
                 haarResponseY + (local_5c * 0x18 + iVar14));
      haarXY_unconditional
                (in_RDI,row,(int)auVar38._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar14),
                 haarResponseY + (iVar4 * 0x18 + iVar14));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar39._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar15),
                 haarResponseY + (local_5c * 0x18 + iVar15));
      haarXY_unconditional
                (in_RDI,row,(int)auVar39._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar15),
                 haarResponseY + (iVar4 * 0x18 + iVar15));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar40._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar16),
                 haarResponseY + (local_5c * 0x18 + iVar16));
      haarXY_unconditional
                (in_RDI,row,(int)auVar40._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar16),
                 haarResponseY + (iVar4 * 0x18 + iVar16));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar41._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar17),
                 haarResponseY + (local_5c * 0x18 + iVar17));
      haarXY_unconditional
                (in_RDI,row,(int)auVar41._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar17),
                 haarResponseY + (iVar4 * 0x18 + iVar17));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar42._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar18),
                 haarResponseY + (local_5c * 0x18 + iVar18));
      haarXY_unconditional
                (in_RDI,row,(int)auVar42._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar18),
                 haarResponseY + (iVar4 * 0x18 + iVar18));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar43._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar19),
                 haarResponseY + (local_5c * 0x18 + iVar19));
      haarXY_unconditional
                (in_RDI,row,(int)auVar43._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar19),
                 haarResponseY + (iVar4 * 0x18 + iVar19));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar44._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar20),
                 haarResponseY + (local_5c * 0x18 + iVar20));
      haarXY_unconditional
                (in_RDI,row,(int)auVar44._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar20),
                 haarResponseY + (iVar4 * 0x18 + iVar20));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar45._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar21),
                 haarResponseY + (local_5c * 0x18 + iVar21));
      haarXY_unconditional
                (in_RDI,row,(int)auVar45._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar21),
                 haarResponseY + (iVar4 * 0x18 + iVar21));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar46._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar22),
                 haarResponseY + (local_5c * 0x18 + iVar22));
      haarXY_unconditional
                (in_RDI,row,(int)auVar46._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar22),
                 haarResponseY + (iVar4 * 0x18 + iVar22));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar47._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar23),
                 haarResponseY + (local_5c * 0x18 + iVar23));
      haarXY_unconditional
                (in_RDI,row,(int)auVar47._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar23),
                 haarResponseY + (iVar4 * 0x18 + iVar23));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar48._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar24),
                 haarResponseY + (local_5c * 0x18 + iVar24));
      haarXY_unconditional
                (in_RDI,row,(int)auVar48._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar24),
                 haarResponseY + (iVar4 * 0x18 + iVar24));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar49._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar25),
                 haarResponseY + (local_5c * 0x18 + iVar25));
      haarXY_unconditional
                (in_RDI,row,(int)auVar49._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar25),
                 haarResponseY + (iVar4 * 0x18 + iVar25));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar50._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar26),
                 haarResponseY + (local_5c * 0x18 + iVar26));
      haarXY_unconditional
                (in_RDI,row,(int)auVar51._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar27),
                 haarResponseY + (iVar4 * 0x18 + iVar27));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar52._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar28),
                 haarResponseY + (local_5c * 0x18 + iVar28));
      haarXY_unconditional
                (in_RDI,row,(int)auVar52._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar28),
                 haarResponseY + (iVar4 * 0x18 + iVar28));
      haarXY_unconditional
                (in_RDI,row,(int)auVar50._0_4_,iVar3,haarResponseX + (iVar4 * 0x18 + iVar26),
                 haarResponseY + (iVar4 * 0x18 + iVar26));
      haarXY_unconditional
                (in_RDI,iVar5,(int)auVar51._0_4_,iVar3,haarResponseX + (local_5c * 0x18 + iVar27),
                 haarResponseY + (local_5c * 0x18 + iVar27));
      local_84 = local_84 + 0x18;
    }
    local_5c = local_5c + 2;
  }
  auVar39._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar39._0_4_ = fVar78 * 0.5;
  auVar170._8_4_ = 0x80000000;
  auVar170._0_8_ = 0x8000000080000000;
  auVar170._12_4_ = 0x80000000;
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  auVar29 = vpternlogd_avx512vl(auVar51,auVar39,auVar170,0xf8);
  auVar29 = vroundss_avx(auVar39,ZEXT416((uint)(fVar78 * 0.5 + auVar29._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar40._0_4_ = fVar78 * 1.5;
  auVar171._8_4_ = 0x80000000;
  auVar171._0_8_ = 0x8000000080000000;
  auVar171._12_4_ = 0x80000000;
  auVar52._8_4_ = 0x3effffff;
  auVar52._0_8_ = 0x3effffff3effffff;
  auVar52._12_4_ = 0x3effffff;
  auVar30 = vpternlogd_avx512vl(auVar52,auVar40,auVar171,0xf8);
  auVar30 = vroundss_avx(auVar40,ZEXT416((uint)(fVar78 * 1.5 + auVar30._0_4_)),0xb);
  auVar41._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar41._0_4_ = fVar78 * 2.5;
  auVar172._8_4_ = 0x80000000;
  auVar172._0_8_ = 0x8000000080000000;
  auVar172._12_4_ = 0x80000000;
  auVar132._8_4_ = 0x3effffff;
  auVar132._0_8_ = 0x3effffff3effffff;
  auVar132._12_4_ = 0x3effffff;
  auVar31 = vpternlogd_avx512vl(auVar132,auVar41,auVar172,0xf8);
  auVar31 = vroundss_avx(auVar41,ZEXT416((uint)(fVar78 * 2.5 + auVar31._0_4_)),0xb);
  fVar58 = auVar31._0_4_;
  auVar42._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar42._0_4_ = fVar78 * 3.5;
  auVar173._8_4_ = 0x80000000;
  auVar173._0_8_ = 0x8000000080000000;
  auVar173._12_4_ = 0x80000000;
  auVar133._8_4_ = 0x3effffff;
  auVar133._0_8_ = 0x3effffff3effffff;
  auVar133._12_4_ = 0x3effffff;
  auVar31 = vpternlogd_avx512vl(auVar133,auVar42,auVar173,0xf8);
  auVar31 = vroundss_avx(auVar42,ZEXT416((uint)(fVar78 * 3.5 + auVar31._0_4_)),0xb);
  auVar43._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar43._0_4_ = fVar78 * 4.5;
  auVar174._8_4_ = 0x80000000;
  auVar174._0_8_ = 0x8000000080000000;
  auVar174._12_4_ = 0x80000000;
  auVar134._8_4_ = 0x3effffff;
  auVar134._0_8_ = 0x3effffff3effffff;
  auVar134._12_4_ = 0x3effffff;
  auVar32 = vpternlogd_avx512vl(auVar134,auVar43,auVar174,0xf8);
  auVar32 = vroundss_avx(auVar43,ZEXT416((uint)(fVar78 * 4.5 + auVar32._0_4_)),0xb);
  auVar44._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar44._0_4_ = fVar78 * 5.5;
  auVar175._8_4_ = 0x80000000;
  auVar175._0_8_ = 0x8000000080000000;
  auVar175._12_4_ = 0x80000000;
  auVar135._8_4_ = 0x3effffff;
  auVar135._0_8_ = 0x3effffff3effffff;
  auVar135._12_4_ = 0x3effffff;
  auVar33 = vpternlogd_avx512vl(auVar135,auVar44,auVar175,0xf8);
  auVar33 = vroundss_avx(auVar44,ZEXT416((uint)(fVar78 * 5.5 + auVar33._0_4_)),0xb);
  auVar45._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar45._0_4_ = fVar78 * 6.5;
  auVar176._8_4_ = 0x80000000;
  auVar176._0_8_ = 0x8000000080000000;
  auVar176._12_4_ = 0x80000000;
  auVar136._8_4_ = 0x3effffff;
  auVar136._0_8_ = 0x3effffff3effffff;
  auVar136._12_4_ = 0x3effffff;
  auVar34 = vpternlogd_avx512vl(auVar136,auVar45,auVar176,0xf8);
  auVar34 = vroundss_avx(auVar45,ZEXT416((uint)(fVar78 * 6.5 + auVar34._0_4_)),0xb);
  auVar46._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar46._0_4_ = fVar78 * 7.5;
  auVar177._8_4_ = 0x80000000;
  auVar177._0_8_ = 0x8000000080000000;
  auVar177._12_4_ = 0x80000000;
  auVar137._8_4_ = 0x3effffff;
  auVar137._0_8_ = 0x3effffff3effffff;
  auVar137._12_4_ = 0x3effffff;
  auVar35 = vpternlogd_avx512vl(auVar137,auVar46,auVar177,0xf8);
  auVar35 = vroundss_avx(auVar46,ZEXT416((uint)(fVar78 * 7.5 + auVar35._0_4_)),0xb);
  fVar66 = auVar35._0_4_;
  auVar47._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar47._0_4_ = fVar78 * 8.5;
  auVar178._8_4_ = 0x80000000;
  auVar178._0_8_ = 0x8000000080000000;
  auVar178._12_4_ = 0x80000000;
  auVar138._8_4_ = 0x3effffff;
  auVar138._0_8_ = 0x3effffff3effffff;
  auVar138._12_4_ = 0x3effffff;
  auVar35 = vpternlogd_avx512vl(auVar138,auVar47,auVar178,0xf8);
  auVar35 = vroundss_avx(auVar47,ZEXT416((uint)(fVar78 * 8.5 + auVar35._0_4_)),0xb);
  auVar48._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar48._0_4_ = fVar78 * 9.5;
  auVar179._8_4_ = 0x80000000;
  auVar179._0_8_ = 0x8000000080000000;
  auVar179._12_4_ = 0x80000000;
  auVar139._8_4_ = 0x3effffff;
  auVar139._0_8_ = 0x3effffff3effffff;
  auVar139._12_4_ = 0x3effffff;
  auVar36 = vpternlogd_avx512vl(auVar139,auVar48,auVar179,0xf8);
  auVar36 = vroundss_avx(auVar48,ZEXT416((uint)(fVar78 * 9.5 + auVar36._0_4_)),0xb);
  auVar49._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar49._0_4_ = fVar78 * 10.5;
  auVar180._8_4_ = 0x80000000;
  auVar180._0_8_ = 0x8000000080000000;
  auVar180._12_4_ = 0x80000000;
  auVar140._8_4_ = 0x3effffff;
  auVar140._0_8_ = 0x3effffff3effffff;
  auVar140._12_4_ = 0x3effffff;
  auVar37 = vpternlogd_avx512vl(auVar140,auVar49,auVar180,0xf8);
  auVar37 = vroundss_avx(auVar49,ZEXT416((uint)(fVar78 * 10.5 + auVar37._0_4_)),0xb);
  auVar50._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar50._0_4_ = fVar78 * 11.5;
  auVar181._8_4_ = 0x80000000;
  auVar181._0_8_ = 0x8000000080000000;
  auVar181._12_4_ = 0x80000000;
  auVar141._8_4_ = 0x3effffff;
  auVar141._0_8_ = 0x3effffff3effffff;
  auVar141._12_4_ = 0x3effffff;
  auVar38 = vpternlogd_avx512vl(auVar141,auVar50,auVar181,0xf8);
  auVar38 = vroundss_avx(auVar50,ZEXT416((uint)(fVar78 * 11.5 + auVar38._0_4_)),0xb);
  fVar78 = fVar58 + auVar30._0_4_;
  fVar1 = fVar58 + auVar29._0_4_;
  fVar2 = fVar58 - auVar29._0_4_;
  fVar54 = fVar58 - auVar30._0_4_;
  fVar55 = fVar58 - auVar31._0_4_;
  fVar56 = fVar58 - auVar32._0_4_;
  fVar57 = fVar58 - auVar33._0_4_;
  fVar58 = fVar58 - auVar34._0_4_;
  fVar59 = fVar66 - auVar31._0_4_;
  fVar60 = fVar66 - auVar32._0_4_;
  fVar61 = fVar66 - auVar33._0_4_;
  fVar62 = fVar66 - auVar34._0_4_;
  fVar63 = fVar66 - auVar35._0_4_;
  fVar64 = fVar66 - auVar36._0_4_;
  fVar65 = fVar66 - auVar37._0_4_;
  fVar66 = fVar66 - auVar38._0_4_;
  gauss_s1_c0[0] = expf(fVar53 * fVar78 * fVar78);
  gauss_s1_c0[1] = expf(fVar53 * fVar1 * fVar1);
  gauss_s1_c0[2] = expf(fVar53 * fVar2 * fVar2);
  gauss_s1_c0[3] = expf(fVar53 * fVar54 * fVar54);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar53 * fVar55 * fVar55);
  gauss_s1_c0[6] = expf(fVar53 * fVar56 * fVar56);
  gauss_s1_c0[7] = expf(fVar53 * fVar57 * fVar57);
  gauss_s1_c0[8] = expf(fVar53 * fVar58 * fVar58);
  gauss_s1_c1[0] = expf(fVar53 * fVar59 * fVar59);
  gauss_s1_c1[1] = expf(fVar53 * fVar60 * fVar60);
  gauss_s1_c1[2] = expf(fVar53 * fVar61 * fVar61);
  gauss_s1_c1[3] = expf(fVar53 * fVar62 * fVar62);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar53 * fVar63 * fVar63);
  gauss_s1_c1[6] = expf(fVar53 * fVar64 * fVar64);
  gauss_s1_c1[7] = expf(fVar53 * fVar65 * fVar65);
  gauss_s1_c1[8] = expf(fVar53 * fVar66 * fVar66);
  for (local_278 = -8; local_278 < 8; local_278 = local_278 + 5) {
    if ((local_278 == -8) || (local_278 == 7)) {
      local_280 = gauss_s1_c1;
    }
    else {
      local_280 = gauss_s1_c0;
    }
    iVar3 = 0;
    if (local_278 < 0) {
      iVar3 = 8;
    }
    iVar4 = 1;
    if (local_278 < 0) {
      iVar4 = -1;
    }
    for (local_28c = -8; local_28c < 8; local_28c = local_28c + 5) {
      if ((local_28c == -8) || (local_28c == 7)) {
        local_298 = gauss_s1_c1;
      }
      else {
        local_298 = gauss_s1_c0;
      }
      local_29c = 0.0;
      local_2a0 = 0.0;
      local_2a4 = 0.0;
      local_2a8 = 0.0;
      local_2ac = 0;
      if (local_28c < 0) {
        local_2ac = 8;
      }
      iVar5 = 1;
      if (local_28c < 0) {
        iVar5 = -1;
      }
      for (local_2b4 = (local_28c + 8) * 0x18;
          SBORROW4(local_2b4,(local_28c + 0x11) * 0x18) !=
          local_2b4 + (local_28c + 0x11) * -0x18 < 0; local_2b4 = local_2b4 + 0x18) {
        local_2bc = iVar3;
        for (local_2c0 = local_278 + 8; local_2c0 < local_278 + 0x11; local_2c0 = local_2c0 + 1) {
          fVar78 = local_280[local_2bc] * local_298[local_2ac] *
                   haarResponseY[local_2b4 + local_2c0];
          fVar1 = local_280[local_2bc] * local_298[local_2ac] * haarResponseX[local_2b4 + local_2c0]
          ;
          local_29c = fVar78 + local_29c;
          local_2a0 = fVar1 + local_2a0;
          auVar142._8_4_ = 0x7fffffff;
          auVar142._0_8_ = 0x7fffffff7fffffff;
          auVar142._12_4_ = 0x7fffffff;
          auVar29 = vpand_avx(ZEXT416((uint)fVar78),auVar142);
          local_2a4 = auVar29._0_4_ + local_2a4;
          auVar143._8_4_ = 0x7fffffff;
          auVar143._0_8_ = 0x7fffffff7fffffff;
          auVar143._12_4_ = 0x7fffffff;
          auVar29 = vpand_avx(ZEXT416((uint)fVar1),auVar143);
          local_2a8 = auVar29._0_4_ + local_2a8;
          local_2bc = iVar4 + local_2bc;
        }
        local_2ac = iVar5 + local_2ac;
      }
      fVar78 = gauss_s2_arr[local_54];
      local_54 = local_54 + 1;
      local_29c = local_29c * fVar78;
      local_2a0 = local_2a0 * fVar78;
      local_2a4 = local_2a4 * fVar78;
      local_2a8 = local_2a8 * fVar78;
      in_RSI[(long)local_4c + 5] = local_29c;
      in_RSI[(long)(local_4c + 1) + 5] = local_2a0;
      in_RSI[(long)(local_4c + 2) + 5] = local_2a4;
      in_RSI[(long)(local_4c + 3) + 5] = local_2a8;
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)local_29c),ZEXT416((uint)local_29c),
                                ZEXT416((uint)(local_2a0 * local_2a0)));
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)local_2a4),ZEXT416((uint)local_2a4),auVar29);
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)local_2a8),ZEXT416((uint)local_2a8),auVar29);
      local_50 = auVar29._0_4_ + local_50;
      local_4c = local_4c + 4;
    }
  }
  fVar78 = sqrtf(local_50);
  for (local_2f4 = 0; local_2f4 < 0x40; local_2f4 = local_2f4 + 1) {
    in_RSI[(long)local_2f4 + 5] = (1.0 / fVar78) * in_RSI[(long)local_2f4 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_rounding_unroll_2_24_True_winner_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    // if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
    //     || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
    //     || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
    //     || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    // { // still need this for rounding to work -.-
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale_add_l0_mul_scale);// + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale_add_l1_mul_scale);// + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=24, k_count+=24) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k12 = k + 12;
                int k13 = k + 13;
                int k14 = k + 14;
                int k15 = k + 15;
                int k16 = k + 16;
                int k17 = k + 17;
                int k18 = k + 18;
                int k19 = k + 19;
                int k20 = k + 20;
                int k21 = k + 21;
                int k22 = k + 22;
                int k23 = k + 23;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int k_count12 = k_count + 12;
                int k_count13 = k_count + 13;
                int k_count14 = k_count + 14;
                int k_count15 = k_count + 15;
                int k_count16 = k_count + 16;
                int k_count17 = k_count + 17;
                int k_count18 = k_count + 18;
                int k_count19 = k_count + 19;
                int k_count20 = k_count + 20;
                int k_count21 = k_count + 21;
                int k_count22 = k_count + 22;
                int k_count23 = k_count + 23;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                float ipoint_x_sub_int_scale_add_k12_mul_scale = ipoint_x_sub_int_scale + k12 * scale;
                float ipoint_x_sub_int_scale_add_k13_mul_scale = ipoint_x_sub_int_scale + k13 * scale;
                float ipoint_x_sub_int_scale_add_k14_mul_scale = ipoint_x_sub_int_scale + k14 * scale;
                float ipoint_x_sub_int_scale_add_k15_mul_scale = ipoint_x_sub_int_scale + k15 * scale;
                float ipoint_x_sub_int_scale_add_k16_mul_scale = ipoint_x_sub_int_scale + k16 * scale;
                float ipoint_x_sub_int_scale_add_k17_mul_scale = ipoint_x_sub_int_scale + k17 * scale;
                float ipoint_x_sub_int_scale_add_k18_mul_scale = ipoint_x_sub_int_scale + k18 * scale;
                float ipoint_x_sub_int_scale_add_k19_mul_scale = ipoint_x_sub_int_scale + k19 * scale;
                float ipoint_x_sub_int_scale_add_k20_mul_scale = ipoint_x_sub_int_scale + k20 * scale;
                float ipoint_x_sub_int_scale_add_k21_mul_scale = ipoint_x_sub_int_scale + k21 * scale;
                float ipoint_x_sub_int_scale_add_k22_mul_scale = ipoint_x_sub_int_scale + k22 * scale;
                float ipoint_x_sub_int_scale_add_k23_mul_scale = ipoint_x_sub_int_scale + k23 * scale;
                int sample_x_sub_int_scale1 = (int) roundf(ipoint_x_sub_int_scale_add_k1_mul_scale);// + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale0 = (int) roundf(ipoint_x_sub_int_scale_add_k0_mul_scale);// + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) roundf(ipoint_x_sub_int_scale_add_k2_mul_scale);// + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) roundf(ipoint_x_sub_int_scale_add_k3_mul_scale);// + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) roundf(ipoint_x_sub_int_scale_add_k4_mul_scale);// + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) roundf(ipoint_x_sub_int_scale_add_k5_mul_scale);// + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) roundf(ipoint_x_sub_int_scale_add_k6_mul_scale);// + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) roundf(ipoint_x_sub_int_scale_add_k7_mul_scale);// + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) roundf(ipoint_x_sub_int_scale_add_k8_mul_scale);// + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) roundf(ipoint_x_sub_int_scale_add_k9_mul_scale);// + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) roundf(ipoint_x_sub_int_scale_add_k10_mul_scale);// + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) roundf(ipoint_x_sub_int_scale_add_k11_mul_scale);// + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale12 = (int) roundf(ipoint_x_sub_int_scale_add_k12_mul_scale);// + (ipoint_x_sub_int_scale_add_k12_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale13 = (int) roundf(ipoint_x_sub_int_scale_add_k13_mul_scale);// + (ipoint_x_sub_int_scale_add_k13_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale14 = (int) roundf(ipoint_x_sub_int_scale_add_k14_mul_scale);// + (ipoint_x_sub_int_scale_add_k14_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale15 = (int) roundf(ipoint_x_sub_int_scale_add_k15_mul_scale);// + (ipoint_x_sub_int_scale_add_k15_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale16 = (int) roundf(ipoint_x_sub_int_scale_add_k16_mul_scale);// + (ipoint_x_sub_int_scale_add_k16_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale17 = (int) roundf(ipoint_x_sub_int_scale_add_k17_mul_scale);// + (ipoint_x_sub_int_scale_add_k17_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale18 = (int) roundf(ipoint_x_sub_int_scale_add_k18_mul_scale);// + (ipoint_x_sub_int_scale_add_k18_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale19 = (int) roundf(ipoint_x_sub_int_scale_add_k19_mul_scale);// + (ipoint_x_sub_int_scale_add_k19_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale20 = (int) roundf(ipoint_x_sub_int_scale_add_k20_mul_scale);// + (ipoint_x_sub_int_scale_add_k20_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale21 = (int) roundf(ipoint_x_sub_int_scale_add_k21_mul_scale);// + (ipoint_x_sub_int_scale_add_k21_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale22 = (int) roundf(ipoint_x_sub_int_scale_add_k22_mul_scale);// + (ipoint_x_sub_int_scale_add_k22_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale23 = (int) roundf(ipoint_x_sub_int_scale_add_k23_mul_scale);// + (ipoint_x_sub_int_scale_add_k23_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count0*24+k_count12], &haarResponseY[l_count0*24+k_count12]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count1*24+k_count12], &haarResponseY[l_count1*24+k_count12]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count0*24+k_count13], &haarResponseY[l_count0*24+k_count13]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count1*24+k_count13], &haarResponseY[l_count1*24+k_count13]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count0*24+k_count14], &haarResponseY[l_count0*24+k_count14]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count1*24+k_count14], &haarResponseY[l_count1*24+k_count14]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count0*24+k_count15], &haarResponseY[l_count0*24+k_count15]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count1*24+k_count15], &haarResponseY[l_count1*24+k_count15]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count0*24+k_count16], &haarResponseY[l_count0*24+k_count16]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count1*24+k_count16], &haarResponseY[l_count1*24+k_count16]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count0*24+k_count17], &haarResponseY[l_count0*24+k_count17]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count1*24+k_count17], &haarResponseY[l_count1*24+k_count17]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count0*24+k_count18], &haarResponseY[l_count0*24+k_count18]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count1*24+k_count18], &haarResponseY[l_count1*24+k_count18]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count0*24+k_count19], &haarResponseY[l_count0*24+k_count19]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count1*24+k_count19], &haarResponseY[l_count1*24+k_count19]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count0*24+k_count20], &haarResponseY[l_count0*24+k_count20]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count1*24+k_count20], &haarResponseY[l_count1*24+k_count20]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count0*24+k_count21], &haarResponseY[l_count0*24+k_count21]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count1*24+k_count22], &haarResponseY[l_count1*24+k_count22]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count0*24+k_count23], &haarResponseY[l_count0*24+k_count23]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count1*24+k_count23], &haarResponseY[l_count1*24+k_count23]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count1*24+k_count21], &haarResponseY[l_count1*24+k_count21]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count0*24+k_count22], &haarResponseY[l_count0*24+k_count22]);
            }
        }
    // } else {
    //     for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
    //         int l0 = l + 0;
    //         int l1 = l + 1;
    //         int l_count0 = l_count + 0;
    //         int l_count1 = l_count + 1;
    //         int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
    //         int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

    //         for (int k=-12, k_count=0; k<12; k+=24, k_count+=24) {
    //             int k0 = k + 0;
    //             int k1 = k + 1;
    //             int k2 = k + 2;
    //             int k3 = k + 3;
    //             int k4 = k + 4;
    //             int k5 = k + 5;
    //             int k6 = k + 6;
    //             int k7 = k + 7;
    //             int k8 = k + 8;
    //             int k9 = k + 9;
    //             int k10 = k + 10;
    //             int k11 = k + 11;
    //             int k12 = k + 12;
    //             int k13 = k + 13;
    //             int k14 = k + 14;
    //             int k15 = k + 15;
    //             int k16 = k + 16;
    //             int k17 = k + 17;
    //             int k18 = k + 18;
    //             int k19 = k + 19;
    //             int k20 = k + 20;
    //             int k21 = k + 21;
    //             int k22 = k + 22;
    //             int k23 = k + 23;
    //             int k_count0 = k_count + 0;
    //             int k_count1 = k_count + 1;
    //             int k_count2 = k_count + 2;
    //             int k_count3 = k_count + 3;
    //             int k_count4 = k_count + 4;
    //             int k_count5 = k_count + 5;
    //             int k_count6 = k_count + 6;
    //             int k_count7 = k_count + 7;
    //             int k_count8 = k_count + 8;
    //             int k_count9 = k_count + 9;
    //             int k_count10 = k_count + 10;
    //             int k_count11 = k_count + 11;
    //             int k_count12 = k_count + 12;
    //             int k_count13 = k_count + 13;
    //             int k_count14 = k_count + 14;
    //             int k_count15 = k_count + 15;
    //             int k_count16 = k_count + 16;
    //             int k_count17 = k_count + 17;
    //             int k_count18 = k_count + 18;
    //             int k_count19 = k_count + 19;
    //             int k_count20 = k_count + 20;
    //             int k_count21 = k_count + 21;
    //             int k_count22 = k_count + 22;
    //             int k_count23 = k_count + 23;
    //             int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
    //             int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
    //             int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
    //             int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
    //             int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
    //             int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
    //             int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
    //             int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
    //             int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
    //             int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
    //             int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
    //             int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);
    //             int sample_x_sub_int_scale12 = (int) (ipoint_x_sub_int_scale_add_05 + k12 * scale);
    //             int sample_x_sub_int_scale13 = (int) (ipoint_x_sub_int_scale_add_05 + k13 * scale);
    //             int sample_x_sub_int_scale14 = (int) (ipoint_x_sub_int_scale_add_05 + k14 * scale);
    //             int sample_x_sub_int_scale15 = (int) (ipoint_x_sub_int_scale_add_05 + k15 * scale);
    //             int sample_x_sub_int_scale16 = (int) (ipoint_x_sub_int_scale_add_05 + k16 * scale);
    //             int sample_x_sub_int_scale17 = (int) (ipoint_x_sub_int_scale_add_05 + k17 * scale);
    //             int sample_x_sub_int_scale18 = (int) (ipoint_x_sub_int_scale_add_05 + k18 * scale);
    //             int sample_x_sub_int_scale19 = (int) (ipoint_x_sub_int_scale_add_05 + k19 * scale);
    //             int sample_x_sub_int_scale20 = (int) (ipoint_x_sub_int_scale_add_05 + k20 * scale);
    //             int sample_x_sub_int_scale21 = (int) (ipoint_x_sub_int_scale_add_05 + k21 * scale);
    //             int sample_x_sub_int_scale22 = (int) (ipoint_x_sub_int_scale_add_05 + k22 * scale);
    //             int sample_x_sub_int_scale23 = (int) (ipoint_x_sub_int_scale_add_05 + k23 * scale);

    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count0*24+k_count12], &haarResponseY[l_count0*24+k_count12]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count1*24+k_count12], &haarResponseY[l_count1*24+k_count12]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count0*24+k_count13], &haarResponseY[l_count0*24+k_count13]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count1*24+k_count13], &haarResponseY[l_count1*24+k_count13]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count0*24+k_count14], &haarResponseY[l_count0*24+k_count14]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count1*24+k_count14], &haarResponseY[l_count1*24+k_count14]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count0*24+k_count15], &haarResponseY[l_count0*24+k_count15]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count1*24+k_count15], &haarResponseY[l_count1*24+k_count15]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count0*24+k_count16], &haarResponseY[l_count0*24+k_count16]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count1*24+k_count16], &haarResponseY[l_count1*24+k_count16]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count0*24+k_count17], &haarResponseY[l_count0*24+k_count17]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count1*24+k_count17], &haarResponseY[l_count1*24+k_count17]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count0*24+k_count18], &haarResponseY[l_count0*24+k_count18]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count1*24+k_count18], &haarResponseY[l_count1*24+k_count18]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count0*24+k_count19], &haarResponseY[l_count0*24+k_count19]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count1*24+k_count19], &haarResponseY[l_count1*24+k_count19]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count0*24+k_count20], &haarResponseY[l_count0*24+k_count20]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count1*24+k_count20], &haarResponseY[l_count1*24+k_count20]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count0*24+k_count21], &haarResponseY[l_count0*24+k_count21]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count1*24+k_count21], &haarResponseY[l_count1*24+k_count21]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count0*24+k_count22], &haarResponseY[l_count0*24+k_count22]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count1*24+k_count22], &haarResponseY[l_count1*24+k_count22]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count0*24+k_count23], &haarResponseY[l_count0*24+k_count23]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count1*24+k_count23], &haarResponseY[l_count1*24+k_count23]);
    //         }
    //     }
    // }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
        // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}